

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>,pstore::gsl::not_null<pstore::transaction_base*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,pstore::uint128*>
          (rule *this,not_null<pstore::transaction_base_*> args,
          not_null<const_pstore::exchange::import_ns::string_mapping_*> args_1,uint128 *args_2)

{
  iterator *piVar1;
  context *pcVar2;
  _Elt_pointer puVar3;
  undefined1 auVar4 [16];
  pointer __p;
  ulong uVar5;
  pointer *__ptr;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_38;
  _Head_base<0UL,_pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_*,_false>
  local_30;
  
  pcVar2 = (this->context_).ptr_;
  local_38._M_head_impl = (rule *)operator_new(0x28);
  ((local_38._M_head_impl)->context_).ptr_ = pcVar2;
  (local_38._M_head_impl)->_vptr_rule = (_func_int **)&PTR__rule_0015d9c8;
  local_38._M_head_impl[1]._vptr_rule = (_func_int **)args_2;
  local_38._M_head_impl[1].context_.ptr_ = (context *)args_1.ptr_;
  local_38._M_head_impl[2]._vptr_rule = (_func_int **)args.ptr_;
  local_30._M_head_impl =
       (object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>
        *)0x0;
  puVar3 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar3 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_38);
  }
  else {
    (puVar3->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
         local_38._M_head_impl;
    local_38._M_head_impl = (rule *)0x0;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_38._M_head_impl != (rule *)0x0) {
    (*(local_38._M_head_impl)->_vptr_rule[1])();
  }
  local_38._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>,_std::default_delete<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::fragment_sections,_pstore::gsl::not_null<pstore::transaction_base_*>,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_pstore::uint128_*>_>_>
                 *)&local_30);
  log_top(this,true);
  uVar5 = std::_V2::system_category();
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar5;
  return (error_code)(auVar4 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }